

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentNotEqualVariable_Test::TestBody(Equality_componentNotEqualVariable_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  AssertionResult local_140 [2];
  AssertHelper local_120 [8];
  Message local_118 [8];
  shared_ptr<libcellml::Entity> local_110;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8 [8];
  Message local_c0 [8];
  shared_ptr<libcellml::Entity> local_b8;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  string local_88 [32];
  undefined1 local_68 [8];
  VariablePtr v;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ComponentPtr c;
  Equality_componentNotEqualVariable_Test *this_local;
  
  c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"name",&local_41);
  libcellml::Component::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"name",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>
            (&local_b8,(shared_ptr<libcellml::Variable> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_a0,"c->equals(v)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x402,pcVar4);
    testing::internal::AssertHelper::operator=(local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_110,(shared_ptr<libcellml::Component> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar5);
  local_f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_110);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_140,local_f8,"v->equals(c)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x403,pcVar4);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    std::__cxx11::string::~string((string *)local_140);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_20);
  return;
}

Assistant:

TEST(Equality, componentNotEqualVariable)
{
    libcellml::ComponentPtr c = libcellml::Component::create("name");
    libcellml::VariablePtr v = libcellml::Variable::create("name");

    EXPECT_FALSE(c->equals(v));
    EXPECT_FALSE(v->equals(c));
}